

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unix-sockets.c
# Opt level: O0

int lws_plat_set_socket_options(lws_vhost *vhost,int fd,int unix_skt)

{
  char *__optval;
  int iVar1;
  size_t sVar2;
  int local_24;
  socklen_t optlen;
  int optval;
  int unix_skt_local;
  int fd_local;
  lws_vhost *vhost_local;
  
  local_24 = 1;
  optlen = unix_skt;
  optval = fd;
  _unix_skt_local = vhost;
  fcntl(fd,2,1);
  if ((optlen == 0) && (_unix_skt_local->ka_time != 0)) {
    local_24 = 1;
    iVar1 = setsockopt(optval,1,9,&local_24,4);
    if (iVar1 < 0) {
      return 1;
    }
    local_24 = (_unix_skt_local->ka_time + _unix_skt_local->ka_interval * _unix_skt_local->ka_probes
               ) * 1000;
    iVar1 = setsockopt(optval,6,0x12,&local_24,4);
    if (iVar1 < 0) {
      return 1;
    }
    local_24 = _unix_skt_local->ka_time;
    iVar1 = setsockopt(optval,6,4,&local_24,4);
    if (iVar1 < 0) {
      return 1;
    }
    local_24 = _unix_skt_local->ka_interval;
    iVar1 = setsockopt(optval,6,5,&local_24,4);
    if (iVar1 < 0) {
      return 1;
    }
    local_24 = _unix_skt_local->ka_probes;
    iVar1 = setsockopt(optval,6,6,&local_24,4);
    if (iVar1 < 0) {
      return 1;
    }
  }
  if (((optlen == 0) && (_unix_skt_local->bind_iface != 0)) &&
     (_unix_skt_local->iface != (char *)0x0)) {
    _lws_log(8,"binding listen skt to %s using SO_BINDTODEVICE\n",_unix_skt_local->iface);
    iVar1 = optval;
    __optval = _unix_skt_local->iface;
    sVar2 = strlen(_unix_skt_local->iface);
    iVar1 = setsockopt(iVar1,1,0x19,__optval,(socklen_t)sVar2);
    if (iVar1 < 0) {
      _lws_log(2,"Failed to bind to device %s\n",_unix_skt_local->iface);
      return 1;
    }
  }
  local_24 = 1;
  if ((optlen == 0) && (iVar1 = setsockopt(optval,6,1,&local_24,4), iVar1 < 0)) {
    vhost_local._4_4_ = 1;
  }
  else {
    vhost_local._4_4_ = lws_plat_set_nonblocking(optval);
  }
  return vhost_local._4_4_;
}

Assistant:

int
lws_plat_set_socket_options(struct lws_vhost *vhost, int fd, int unix_skt)
{
	int optval = 1;
	socklen_t optlen = sizeof(optval);

#if defined(__APPLE__) || \
    defined(__FreeBSD__) || defined(__FreeBSD_kernel__) || \
    defined(__NetBSD__) || \
    defined(__OpenBSD__) || \
    defined(__HAIKU__)
	struct protoent *tcp_proto;
#endif

	(void)fcntl(fd, F_SETFD, FD_CLOEXEC);

	if (!unix_skt && vhost->ka_time) {
		/* enable keepalive on this socket */
		optval = 1;
		if (setsockopt(fd, SOL_SOCKET, SO_KEEPALIVE,
			       (const void *)&optval, optlen) < 0)
			return 1;

#if defined(__APPLE__) || \
    defined(__FreeBSD__) || defined(__FreeBSD_kernel__) || \
    defined(__NetBSD__) || \
    defined(__CYGWIN__) || defined(__OpenBSD__) || defined (__sun) || \
    defined(__HAIKU__)

		/*
		 * didn't find a way to set these per-socket, need to
		 * tune kernel systemwide values
		 */
#else
		/* set the keepalive conditions we want on it too */

#if defined(LWS_HAVE_TCP_USER_TIMEOUT)
		optval = 1000 * (vhost->ka_time +
				 (vhost->ka_interval * vhost->ka_probes));
		if (setsockopt(fd, IPPROTO_TCP, TCP_USER_TIMEOUT,
			       (const void *)&optval, optlen) < 0)
			return 1;
#endif
		optval = vhost->ka_time;
		if (setsockopt(fd, IPPROTO_TCP, TCP_KEEPIDLE,
			       (const void *)&optval, optlen) < 0)
			return 1;

		optval = vhost->ka_interval;
		if (setsockopt(fd, IPPROTO_TCP, TCP_KEEPINTVL,
			       (const void *)&optval, optlen) < 0)
			return 1;

		optval = vhost->ka_probes;
		if (setsockopt(fd, IPPROTO_TCP, TCP_KEEPCNT,
			       (const void *)&optval, optlen) < 0)
			return 1;
#endif
	}

#if defined(SO_BINDTODEVICE)
	if (!unix_skt && vhost->bind_iface && vhost->iface) {
		lwsl_info("binding listen skt to %s using SO_BINDTODEVICE\n", vhost->iface);
		if (setsockopt(fd, SOL_SOCKET, SO_BINDTODEVICE, vhost->iface,
				(socklen_t)strlen(vhost->iface)) < 0) {
			lwsl_warn("Failed to bind to device %s\n", vhost->iface);
			return 1;
		}
	}
#endif

	/* Disable Nagle */
	optval = 1;
#if defined (__sun) || defined(__QNX__)
	if (!unix_skt && setsockopt(fd, IPPROTO_TCP, TCP_NODELAY, (const void *)&optval, optlen) < 0)
		return 1;
#elif !defined(__APPLE__) && \
      !defined(__FreeBSD__) && !defined(__FreeBSD_kernel__) &&        \
      !defined(__NetBSD__) && \
      !defined(__OpenBSD__) && \
      !defined(__HAIKU__)
	if (!unix_skt && setsockopt(fd, SOL_TCP, TCP_NODELAY, (const void *)&optval, optlen) < 0)
		return 1;
#else
	tcp_proto = getprotobyname("TCP");
	if (!unix_skt && setsockopt(fd, tcp_proto->p_proto, TCP_NODELAY, &optval, optlen) < 0)
		return 1;
#endif

	return lws_plat_set_nonblocking(fd);
}